

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo_approach.cpp
# Opt level: O0

vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *
histogram_approach(vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                   *__return_storage_ptr__,Mat *img)

{
  reference pvVar1;
  iterator iVar2;
  iterator iVar3;
  pointer plVar4;
  difference_type dVar5;
  pair<__gnu_cxx::__normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>,___gnu_cxx::__normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>_>
  pVar6;
  value_type local_1e0;
  value_type local_1d0;
  value_type local_1c0;
  value_type local_1b0;
  long local_1a0;
  size_t lower_i;
  line_bound *local_190;
  difference_type local_188;
  size_t upper_i;
  line_bound *local_178;
  __normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_> local_170;
  __normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_> local_168;
  __normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_> upper_b;
  size_t upper_threshold;
  pair<__gnu_cxx::__normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>,___gnu_cxx::__normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>_>
  minmax;
  line_bound local_d0;
  int local_b4;
  undefined1 local_b0 [4];
  int i;
  vector<line_bound,_std::allocator<line_bound>_> horz_histo;
  undefined1 local_90 [4];
  int row_size;
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  Mat *local_18;
  Mat *img_local;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *result;
  
  local_18 = img;
  img_local = (Mat *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"img",&local_39);
  cv::namedWindow(local_38,0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"img",&local_71);
  cv::_InputArray::_InputArray((_InputArray *)local_90,local_18);
  cv::imshow(local_70,(_InputArray *)local_90);
  cv::_InputArray::~_InputArray((_InputArray *)local_90);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  cv::waitKey(0);
  cv::destroyAllWindows();
  horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = *(int *)(local_18 + 8);
  horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
            (__return_storage_ptr__);
  std::vector<line_bound,_std::allocator<line_bound>_>::vector
            ((vector<line_bound,_std::allocator<line_bound>_> *)local_b0);
  std::vector<line_bound,_std::allocator<line_bound>_>::resize
            ((vector<line_bound,_std::allocator<line_bound>_> *)local_b0,
             (long)horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_);
  for (local_b4 = 0;
      local_b4 <
      horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_b4 = local_b4 + 1) {
    cv::Mat::row((Mat *)&minmax.second,(int)local_18);
    find_longest_line(&local_d0,(Mat *)&minmax.second);
    pvVar1 = std::vector<line_bound,_std::allocator<line_bound>_>::operator[]
                       ((vector<line_bound,_std::allocator<line_bound>_> *)local_b0,(long)local_b4);
    pvVar1->ibegin = local_d0.ibegin;
    pvVar1->iend = local_d0.iend;
    pvVar1->size = local_d0.size;
    cv::Mat::~Mat((Mat *)&minmax.second);
  }
  iVar2 = std::vector<line_bound,_std::allocator<line_bound>_>::begin
                    ((vector<line_bound,_std::allocator<line_bound>_> *)local_b0);
  iVar3 = std::vector<line_bound,_std::allocator<line_bound>_>::end
                    ((vector<line_bound,_std::allocator<line_bound>_> *)local_b0);
  pVar6 = std::
          minmax_element<__gnu_cxx::__normal_iterator<line_bound*,std::vector<line_bound,std::allocator<line_bound>>>,histogram_approach(cv::Mat_const&)::__0>
                    (iVar2._M_current,iVar3._M_current);
  minmax.first = pVar6.second._M_current;
  plVar4 = __gnu_cxx::
           __normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>::
           operator->(&minmax.first);
  upper_b._M_current = (line_bound *)plVar4->size;
  local_170._M_current =
       (line_bound *)
       std::vector<line_bound,_std::allocator<line_bound>_>::begin
                 ((vector<line_bound,_std::allocator<line_bound>_> *)local_b0);
  local_178 = (line_bound *)
              std::vector<line_bound,_std::allocator<line_bound>_>::end
                        ((vector<line_bound,_std::allocator<line_bound>_> *)local_b0);
  upper_i = (size_t)upper_b._M_current;
  local_168 = std::
              find_if<__gnu_cxx::__normal_iterator<line_bound*,std::vector<line_bound,std::allocator<line_bound>>>,histogram_approach(cv::Mat_const&)::__1>
                        (local_170,
                         (__normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>
                          )local_178,upper_b._M_current);
  local_190 = (line_bound *)
              std::vector<line_bound,_std::allocator<line_bound>_>::begin
                        ((vector<line_bound,_std::allocator<line_bound>_> *)local_b0);
  lower_i = (size_t)local_168._M_current;
  dVar5 = std::
          distance<__gnu_cxx::__normal_iterator<line_bound*,std::vector<line_bound,std::allocator<line_bound>>>>
                    ((__normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>
                      )local_190,local_168);
  local_188 = dVar5;
  plVar4 = __gnu_cxx::
           __normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>::
           operator->(&minmax.first);
  local_1a0 = dVar5 + plVar4->size;
  local_188 = 0;
  plVar4 = __gnu_cxx::
           __normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>::
           operator->(&local_168);
  plVar4->ibegin = 0;
  __gnu_cxx::__normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>
  ::operator->(&local_168);
  plVar4 = __gnu_cxx::
           __normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>::
           operator->(&local_168);
  local_1b0._M_elems[0] = (int)plVar4->ibegin;
  local_1b0._M_elems[1] = (int)local_188;
  plVar4 = __gnu_cxx::
           __normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>::
           operator->(&local_168);
  local_1b0._M_elems[2] = (int)plVar4->iend;
  local_1b0._M_elems[3] = (int)local_188;
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::push_back
            (__return_storage_ptr__,&local_1b0);
  plVar4 = __gnu_cxx::
           __normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>::
           operator->(&local_168);
  local_1c0._M_elems[0] = (int)plVar4->ibegin;
  local_1c0._M_elems[1] = (int)local_188;
  plVar4 = __gnu_cxx::
           __normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>::
           operator->(&local_168);
  local_1c0._M_elems[2] = (int)plVar4->ibegin;
  local_1c0._M_elems[3] = (int)local_1a0;
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::push_back
            (__return_storage_ptr__,&local_1c0);
  plVar4 = __gnu_cxx::
           __normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>::
           operator->(&local_168);
  local_1d0._M_elems[0] = (int)plVar4->iend;
  local_1d0._M_elems[1] = (int)local_188;
  plVar4 = __gnu_cxx::
           __normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>::
           operator->(&local_168);
  local_1d0._M_elems[2] = (int)plVar4->iend;
  local_1d0._M_elems[3] = (int)local_1a0;
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::push_back
            (__return_storage_ptr__,&local_1d0);
  plVar4 = __gnu_cxx::
           __normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>::
           operator->(&local_168);
  local_1e0._M_elems[0] = (int)plVar4->ibegin;
  local_1e0._M_elems[1] = (int)local_1a0;
  plVar4 = __gnu_cxx::
           __normal_iterator<line_bound_*,_std::vector<line_bound,_std::allocator<line_bound>_>_>::
           operator->(&local_168);
  local_1e0._M_elems[2] = (int)plVar4->iend;
  local_1e0._M_elems[3] = (int)local_1a0;
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::push_back
            (__return_storage_ptr__,&local_1e0);
  horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  std::vector<line_bound,_std::allocator<line_bound>_>::~vector
            ((vector<line_bound,_std::allocator<line_bound>_> *)local_b0);
  if ((horz_histo.super__Vector_base<line_bound,_std::allocator<line_bound>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
    std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::~vector
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::array<int, 4>> histogram_approach(const cv::Mat& img)
{
    cv::namedWindow("img", cv::WINDOW_NORMAL);
    cv::imshow("img", img);
    cv::waitKey(0);
    cv::destroyAllWindows();

    const int row_size = img.rows;
    std::vector<std::array<int, 4>> result;

    std::vector<line_bound> horz_histo;
    horz_histo.resize(row_size);

    for(int i = 0; i < row_size; i++)
    {
        horz_histo[i] = find_longest_line(img.row(i));
    }

    auto minmax = std::minmax_element(horz_histo.begin(), horz_histo.end(),
        [](const line_bound& lval, const line_bound& rval) { return lval.size < rval.size; });

    auto upper_threshold = minmax.second->size;

    auto upper_b = std::find_if(horz_histo.begin(), horz_histo.end(),
        [upper_threshold](const line_bound& v) { return v.size >= upper_threshold; });

    std::size_t upper_i = std::distance(horz_histo.begin(), upper_b);
    std::size_t lower_i = upper_i + minmax.second->size;
    upper_i *= static_cast<std::size_t>(0.95);
    lower_i *= static_cast<std::size_t>(1.05);
    upper_b->ibegin *= static_cast<std::size_t>(0.95);
    upper_b->iend *= static_cast<std::size_t>(1.05);

    result.push_back({int(upper_b->ibegin), int(upper_i), int(upper_b->iend), int(upper_i)});
    result.push_back({int(upper_b->ibegin), int(upper_i), int(upper_b->ibegin), int(lower_i)});
    result.push_back({int(upper_b->iend), int(upper_i), int(upper_b->iend), int(lower_i)});
    result.push_back({int(upper_b->ibegin), int(lower_i), int(upper_b->iend), int(lower_i)});

    return result;
}